

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::yyjson_mut_val_write_file
               (char *path,yyjson_mut_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,
               yyjson_write_err *err)

{
  bool bVar1;
  u8 *dat;
  yyjson_write_err *pyVar2;
  undefined **alc_ptr_00;
  yyjson_write_err *err_00;
  usize dat_len;
  yyjson_write_err dummy_err;
  usize local_40;
  yyjson_write_err local_38;
  
  local_40 = 0;
  alc_ptr_00 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    alc_ptr_00 = &alc_ptr->malloc;
  }
  err_00 = err;
  if (err == (yyjson_write_err *)0x0) {
    err_00 = &local_38;
  }
  if ((path == (char *)0x0) || (*path == '\0')) {
    pyVar2 = &local_38;
    if (err != (yyjson_write_err *)0x0) {
      pyVar2 = err;
    }
    pyVar2->msg = "input path is invalid";
    err_00->code = 1;
    bVar1 = false;
  }
  else {
    bVar1 = false;
    dat = (u8 *)yyjson_mut_write_opts_impl(val,0,flg,(yyjson_alc *)alc_ptr_00,&local_40,err_00);
    if (dat != (u8 *)0x0) {
      bVar1 = write_dat_to_file(path,dat,local_40,err_00);
      (*((yyjson_alc *)alc_ptr_00)->free)(((yyjson_alc *)alc_ptr_00)->ctx,dat);
    }
  }
  return bVar1;
}

Assistant:

bool yyjson_mut_val_write_file(const char *path,
                               const yyjson_mut_val *val,
                               yyjson_write_flag flg,
                               const yyjson_alc *alc_ptr,
                               yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    u8 *dat;
    usize dat_len = 0;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;
    bool suc;

    alc_ptr = alc_ptr ? alc_ptr : &YYJSON_DEFAULT_ALC;
    err = err ? err : &dummy_err;
    if (unlikely(!path || !*path)) {
        err->msg = "input path is invalid";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return false;
    }

    dat = (u8 *)yyjson_mut_val_write_opts(root, flg, alc_ptr, &dat_len, err);
    if (unlikely(!dat)) return false;
    suc = write_dat_to_file(path, dat, dat_len, err);
    alc_ptr->free(alc_ptr->ctx, dat);
    return suc;
}